

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlDocPtr xmlCtxtReadDoc(xmlParserCtxtPtr ctxt,xmlChar *str,char *URL,char *encoding,int options)

{
  xmlParserInputPtr input;
  xmlDocPtr pxVar1;
  
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    xmlCtxtReset(ctxt);
    xmlCtxtUseOptions(ctxt,options);
    input = xmlCtxtNewInputFromString(ctxt,URL,(char *)str,encoding,2);
    if (input != (xmlParserInputPtr)0x0) {
      pxVar1 = xmlCtxtParseDocument(ctxt,input);
      return pxVar1;
    }
  }
  return (xmlDocPtr)0x0;
}

Assistant:

xmlDocPtr
xmlCtxtReadDoc(xmlParserCtxtPtr ctxt, const xmlChar *str,
               const char *URL, const char *encoding, int options)
{
    xmlParserInputPtr input;

    if (ctxt == NULL)
        return(NULL);

    xmlCtxtReset(ctxt);
    xmlCtxtUseOptions(ctxt, options);

    input = xmlCtxtNewInputFromString(ctxt, URL, (const char *) str, encoding,
                                      XML_INPUT_BUF_STATIC);
    if (input == NULL)
        return(NULL);

    return(xmlCtxtParseDocument(ctxt, input));
}